

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_GetSetBGR_Test::TestBody(Image_GetSetBGR_Test *this)

{
  PixelFormat format;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  long lVar4;
  Allocator alloc;
  float *pfVar5;
  Point2i p;
  char *pcVar6;
  float *pfVar7;
  ColorEncodingHandle *encoding;
  int x;
  ulong uVar8;
  int c;
  int c_00;
  long lVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  undefined1 auVar13 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertionResult gtest_ar_1;
  ImageChannelValues rgb;
  AssertionResult gtest_ar_;
  Float qv;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageChannelDesc bgrDesc;
  Image image;
  Float local_2a8;
  undefined4 uStack_2a4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  AssertHelper local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float local_270 [2];
  undefined1 *local_268;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  undefined1 local_258 [16];
  long *local_248 [2];
  long local_238 [3];
  undefined1 local_220 [20];
  float local_20c;
  float local_208 [2];
  size_t local_200;
  size_t local_1f8;
  PixelFormat local_1f0;
  Float local_1ec;
  undefined1 **local_1e8;
  undefined1 **local_1e0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1d8;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  ulong local_1a0;
  ulong local_198;
  ColorEncodingHandle local_190;
  PixelFormat local_184 [3];
  ImageChannelDesc local_178;
  Image local_148;
  
  GetFloatPixels(&local_1d8,(Point2i)0x2000000007,3);
  local_184[0] = U256;
  local_184[1] = Half;
  lVar4 = 0;
  local_184[2] = 2;
  local_1e0 = &local_268;
  local_1e8 = &local_268;
  do {
    format = *(PixelFormat *)((long)local_184 + lVar4);
    local_288._0_8_ = local_278;
    local_1b8 = lVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"R","");
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"G","");
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"B","");
    local_190.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_190;
    channels.n = 3;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
    pbrt::Image::Image(&local_148,format,(Point2i)0x2000000007,channels,encoding,alloc);
    lVar4 = -0x60;
    plVar11 = local_238;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
    lVar12 = 0;
    lVar4 = 0;
    local_1f0 = format;
    do {
      uVar8 = 0;
      lVar10 = lVar12;
      local_238[2] = lVar4;
      do {
        lVar9 = 0;
        do {
          pbrt::Image::SetChannel
                    (&local_148,(Point2i)(lVar4 << 0x20 | uVar8),(int)lVar9,
                     *(Float *)((long)local_1d8.ptr + lVar9 * 4 + lVar10));
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0xc;
      } while (uVar8 != 7);
      lVar12 = lVar12 + 0x54;
      lVar4 = local_238[2] + 1;
    } while (lVar4 != 0x20);
    local_288._0_8_ = local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"B","");
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"G","");
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"R","");
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
    pbrt::Image::GetChannelDesc(&local_178,&local_148,requestedChannels);
    lVar4 = -0x60;
    plVar11 = local_238;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
    local_220[0] = (internal)(local_178.offset.nStored != 0);
    local_220._8_8_ = (float *)0x0;
    if (local_178.offset.nStored == 0) {
      testing::Message::Message((Message *)&local_2a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_288,(internal *)local_220,(AssertionResult *)"bool(bgrDesc)",
                 "false","true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0xc0,(char *)local_288._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_2a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
      if ((undefined1 *)local_288._0_8_ != local_278) {
        operator_delete((void *)local_288._0_8_,(long)local_278 + 1);
      }
      if (local_2a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_2a0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_2a0.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_220 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar4 = 0;
    lVar12 = 0;
    do {
      local_1a0 = lVar12 << 0x20;
      uVar8 = 0;
      local_238[2] = lVar4;
      local_1b0 = lVar12;
      local_1a8 = lVar4;
      do {
        p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_1a0 | uVar8);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)local_288,&local_148,p,(WrapMode2D)0x200000002);
        local_2a8 = 4.2039e-45;
        local_2a0.ptr_ = local_260;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_220,"3","rgb.size()",(int *)&local_2a8,
                   (unsigned_long *)&local_2a0);
        if (local_220[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_2a0);
          pcVar6 = "";
          if ((float *)local_220._8_8_ != (float *)0x0) {
            pcVar6 = *(char **)local_220._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_2a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xc5,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_2a8,(Message *)&local_2a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
          if (local_2a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_2a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_2a0.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_220 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)local_220,&local_148,p,&local_178,(WrapMode2D)0x200000002);
        pfVar5 = (float *)local_288._8_8_;
        if ((float *)local_288._8_8_ == (float *)0x0) {
          pfVar5 = (float *)local_278;
        }
        pfVar7 = (float *)(local_220._8_8_ + 8);
        if ((float *)local_220._8_8_ == (float *)0x0) {
          pfVar7 = local_208;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a0,"rgb[0]","bgr[2]",pfVar5,pfVar7);
        if (local_2a0.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2a8);
          pcVar6 = "";
          if (local_298.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((local_298.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,200,pcVar6);
          testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2a8);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          if (CONCAT44(uStack_2a4,local_2a8) != 0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && ((long *)CONCAT44(uStack_2a4,local_2a8) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(uStack_2a4,local_2a8) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_298,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        pfVar5 = (float *)(local_288._8_8_ + 4);
        if ((float *)local_288._8_8_ == (float *)0x0) {
          pfVar5 = (float *)(local_278 + 4);
        }
        pfVar7 = (float *)(local_220._8_8_ + 4);
        if ((float *)local_220._8_8_ == (float *)0x0) {
          pfVar7 = &local_20c;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a0,"rgb[1]","bgr[1]",pfVar5,pfVar7);
        if (local_2a0.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2a8);
          pcVar6 = "";
          if (local_298.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((local_298.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xc9,pcVar6);
          testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2a8);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          if (CONCAT44(uStack_2a4,local_2a8) != 0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && ((long *)CONCAT44(uStack_2a4,local_2a8) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(uStack_2a4,local_2a8) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_298,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        pfVar5 = (float *)(local_288._8_8_ + 8);
        if ((float *)local_288._8_8_ == (float *)0x0) {
          pfVar5 = local_270;
        }
        pfVar7 = (float *)local_220._8_8_;
        if ((float *)local_220._8_8_ == (float *)0x0) {
          pfVar7 = (float *)(local_220 + 0x10);
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&local_2a0,"rgb[2]","bgr[0]",pfVar5,pfVar7);
        if (local_2a0.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_2a8);
          pcVar6 = "";
          if (local_298.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((local_298.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xca,pcVar6);
          testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2a8);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          if (CONCAT44(uStack_2a4,local_2a8) != 0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && ((long *)CONCAT44(uStack_2a4,local_2a8) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(uStack_2a4,local_2a8) + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_298,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        lVar12 = 0;
        c_00 = 0;
        lVar4 = local_238[2];
        local_198 = uVar8;
        do {
          pfVar5 = (float *)local_288._8_8_;
          local_2a8 = pbrt::Image::GetChannel(&local_148,p,c_00,(WrapMode2D)0x200000002);
          if (pfVar5 == (float *)0x0) {
            pfVar5 = (float *)local_278;
          }
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&local_2a0,"rgb[c]","image.GetChannel({x, y}, c)",
                     (float *)((long)pfVar5 + lVar12),&local_2a8);
          if (local_2a0.ptr_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_2a8);
            pcVar6 = "";
            if (local_298.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = ((local_298.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_290,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0xcd,pcVar6);
            testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2a8);
            testing::internal::AssertHelper::~AssertHelper(&local_290);
            if (CONCAT44(uStack_2a4,local_2a8) != 0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && ((long *)CONCAT44(uStack_2a4,local_2a8) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(uStack_2a4,local_2a8) + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_298,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_1f0 == U256) {
            pfVar5 = (float *)local_288._8_8_;
            if ((float *)local_288._8_8_ == (float *)0x0) {
              pfVar5 = (float *)local_278;
            }
            local_290.data_._0_4_ = 0x3b00c24b;
            auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416(*(uint *)((long)local_1d8.ptr + lVar4)));
            uVar1 = vcmpss_avx512f(ZEXT416(*(uint *)((long)local_1d8.ptr + lVar4)),
                                   ZEXT816(0) << 0x40,1);
            auVar2._8_4_ = 0x7fffffff;
            auVar2._0_8_ = 0x7fffffff7fffffff;
            auVar2._12_4_ = 0x7fffffff;
            auVar13 = vandps_avx512vl(ZEXT416((uint)(*(float *)((long)pfVar5 + lVar12) -
                                                    (float)((uint)!(bool)((byte)uVar1 & 1) *
                                                           auVar13._0_4_))),auVar2);
            local_2a8 = auVar13._0_4_;
            testing::internal::CmpHelperLT<float,float>
                      ((internal *)&local_2a0,"std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1))",
                       "0.501f / 255.f",(float *)&local_2a8,(float *)&local_290);
            if (local_2a0.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_2a8);
              pcVar6 = "";
              if (local_298.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((local_298.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_290,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xd1,pcVar6);
              testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2a8);
              testing::internal::AssertHelper::~AssertHelper(&local_290);
              if (CONCAT44(uStack_2a4,local_2a8) != 0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && ((long *)CONCAT44(uStack_2a4,local_2a8) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(uStack_2a4,local_2a8) + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_298,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            local_1ec = modelQuantization(*(Float *)((long)local_1d8.ptr + lVar4),local_1f0);
            pfVar5 = (float *)local_288._8_8_;
            if ((float *)local_288._8_8_ == (float *)0x0) {
              pfVar5 = (float *)local_278;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_2a0,"rgb[c]","qv",(float *)((long)pfVar5 + lVar12),
                       &local_1ec);
            if (local_2a0.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_2a8);
              pcVar6 = "";
              if (local_298.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = ((local_298.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_290,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xd4,pcVar6);
              testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_2a8);
              testing::internal::AssertHelper::~AssertHelper(&local_290);
              if (CONCAT44(uStack_2a4,local_2a8) != 0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && ((long *)CONCAT44(uStack_2a4,local_2a8) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(uStack_2a4,local_2a8) + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_298,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          lVar4 = lVar4 + 4;
          c_00 = c_00 + 1;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0xc);
        local_1f8 = 0;
        (**(code **)(*(long *)CONCAT71(local_220._1_7_,local_220[0]) + 0x18))
                  ((long *)CONCAT71(local_220._1_7_,local_220[0]),local_220._8_8_,local_200 << 2,4);
        local_260 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        (**(code **)(*(long *)local_288._0_8_ + 0x18))
                  (local_288._0_8_,local_288._8_8_,(long)local_268 << 2,4);
        local_238[2] = local_238[2] + 0xc;
        uVar8 = local_198 + 1;
      } while (uVar8 != 7);
      lVar12 = local_1b0 + 1;
      lVar4 = local_1a8 + 0x54;
    } while (lVar12 != 0x20);
    local_178.offset.nStored = 0;
    (*(local_178.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_178.offset.alloc.memoryResource,local_178.offset.ptr,
               local_178.offset.nAlloc << 2,4);
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    lVar4 = local_1b8 + 4;
  } while (lVar4 != 0xc);
  local_1d8.nStored = 0;
  (*(local_1d8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1d8.alloc.memoryResource,local_1d8.ptr,local_1d8.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Image, GetSetBGR) {
    Point2i res(7, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x)
                for (int c = 0; c < 3; ++c)
                    image.SetChannel({x, y}, c, rgbPixels[3 * y * res[0] + 3 * x + c]);

        ImageChannelDesc bgrDesc = image.GetChannelDesc({"B", "G", "R"});
        EXPECT_TRUE(bool(bgrDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues rgb = image.GetChannels({x, y});
                EXPECT_EQ(3, rgb.size());

                ImageChannelValues bgr = image.GetChannels({x, y}, bgrDesc);
                EXPECT_EQ(rgb[0], bgr[2]);
                EXPECT_EQ(rgb[1], bgr[1]);
                EXPECT_EQ(rgb[2], bgr[0]);

                for (int c = 0; c < 3; ++c) {
                    EXPECT_EQ(rgb[c], image.GetChannel({x, y}, c));
                    int offset = 3 * y * res[0] + 3 * x + c;
                    if (format == PixelFormat::U256)
                        EXPECT_LT(std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1)),
                                  0.501f / 255.f);
                    else {
                        Float qv = modelQuantization(rgbPixels[offset], format);
                        EXPECT_EQ(rgb[c], qv);
                    }
                }
            }
    }
}